

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionGenerator.cpp
# Opt level: O1

void __thiscall InstructionGenerator::genCompareLessThanOrEqual(InstructionGenerator *this)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar1;
  iterator iVar2;
  undefined1 local_d0 [8];
  _Alloc_hider local_c8;
  char local_b8 [16];
  bool local_a8;
  uint local_a4;
  undefined1 *local_a0;
  long local_98;
  undefined1 local_90 [16];
  Variable local_80;
  Variable local_50;
  
  pvVar1 = this->bytecode;
  local_d0._0_4_ = 0x14;
  iVar2._M_current =
       (pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<Instruction>
              (pvVar1,iVar2,(Instruction *)local_d0);
  }
  else {
    *iVar2._M_current = 0x14;
    (pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  pvVar1 = this->bytecode;
  local_d0._0_4_ = INT;
  iVar2._M_current =
       (pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<int>
              (pvVar1,iVar2,(int *)local_d0);
  }
  else {
    *iVar2._M_current = 0;
    (pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  VirtualStack::pop(&local_50,&this->super_VirtualStack);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.identifier._M_dataplus._M_p != &local_50.identifier.field_2) {
    operator_delete(local_50.identifier._M_dataplus._M_p);
  }
  VirtualStack::pop(&local_80,&this->super_VirtualStack);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.identifier._M_dataplus._M_p != &local_80.identifier.field_2) {
    operator_delete(local_80.identifier._M_dataplus._M_p);
  }
  local_a0 = local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"");
  local_d0._0_4_ = BOOL;
  local_c8._M_p = local_b8;
  std::__cxx11::string::_M_construct<char*>((string *)&local_c8,local_a0,local_a0 + local_98);
  local_a8 = false;
  local_a4 = 0;
  VirtualStack::push(&this->super_VirtualStack,(Variable *)local_d0);
  if (local_c8._M_p != local_b8) {
    operator_delete(local_c8._M_p);
  }
  if (local_a0 != local_90) {
    operator_delete(local_a0);
  }
  return;
}

Assistant:

void InstructionGenerator::genCompareLessThanOrEqual()
{
    bytecode->emplace_back(Instruction::COMPARE_LESS_THAN_OR_EQUAL);
    bytecode->emplace_back(0);
    pop();
    pop();
    push(Variable("", DataType::BOOL));
}